

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context,sysbvm_tuple_t supertype)

{
  sysbvm_object_tuple_t *psVar1;
  uint64_t value;
  sysbvm_tuple_t sVar2;
  ulong uVar3;
  
  psVar1 = sysbvm_context_allocatePointerTuple(context,(context->roots).metaclassType,0x1e);
  psVar1[2].header.field_0.typePointer = supertype;
  psVar1[4].field_1.pointers[0] = 0x1b;
  if (supertype == 0) {
    value = 0x1d;
  }
  else {
    if ((supertype & 0xf) == 0) {
      uVar3 = *(ulong *)(supertype + 0x58);
      if (uVar3 == 0 || (uVar3 & 0xf) != 0) {
        uVar3 = (long)uVar3 >> 4;
      }
      else {
        uVar3 = *(ulong *)(uVar3 + 0x10);
      }
    }
    else {
      uVar3 = 0;
    }
    value = 0x1d;
    if (0x1d < uVar3) {
      value = uVar3;
    }
  }
  if (value + 0x800000000000000 >> 0x3c == 0) {
    sVar2 = value << 4 | 0xb;
  }
  else {
    sVar2 = sysbvm_tuple_uint64_encodeBig(context,value);
  }
  psVar1[3].field_1.pointers[0] = sVar2;
  psVar1[4].header.field_0.typePointer = 0xb;
  psVar1[4].header.identityHashAndFlags = 0xb;
  psVar1[4].header.objectSize = 0;
  return (sysbvm_tuple_t)psVar1;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createAnonymousMetaclass(sysbvm_context_t *context, sysbvm_tuple_t supertype)
{
    sysbvm_metaclass_t* result = (sysbvm_metaclass_t*)sysbvm_context_allocatePointerTuple(context, context->roots.metaclassType, SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_metaclass_t));
    result->super.super.supertype = supertype;
    result->super.super.flags = sysbvm_tuple_bitflags_encode(SYSBVM_TYPE_FLAGS_METATYPE_REQUIRED_FLAGS);

    size_t slotCount = SYSBVM_SLOT_COUNT_FOR_STRUCTURE_TYPE(sysbvm_class_t);
    if(supertype)
    {
        size_t superTypeSlotCount = sysbvm_type_getTotalSlotCount(supertype);
        if(superTypeSlotCount > slotCount)
            slotCount = superTypeSlotCount;
    }
    
    result->super.super.totalSlotCount = sysbvm_tuple_size_encode(context, slotCount);
    result->super.super.instanceSize = sysbvm_tuple_size_encode(context, 0);
    result->super.super.instanceAlignment = sysbvm_tuple_size_encode(context, 0);
    return (sysbvm_tuple_t)result;
}